

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscalls.cpp
# Opt level: O0

external_function *
skiwi::convert_external_to_vm(external_function *__return_storage_ptr__,external_function *ext)

{
  bool bVar1;
  argtype aVar2;
  reference paVar3;
  argtype local_50;
  argtype local_4c;
  const_iterator cStack_48;
  argtype arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
  *__range1;
  external_function *ext_local;
  external_function *ef;
  
  assembler::external_function::external_function(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)ext);
  __return_storage_ptr__->address = ext->address;
  aVar2 = anon_unknown_15::convert(ext->return_type);
  __return_storage_ptr__->return_type = aVar2;
  __end1 = std::
           vector<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
           ::begin(&ext->arguments);
  cStack_48 = std::
              vector<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
              ::end(&ext->arguments);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8), bVar1) {
    paVar3 = __gnu_cxx::
             __normal_iterator<const_skiwi::external_function::argtype_*,_std::vector<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>_>
             ::operator*(&__end1);
    local_4c = *paVar3;
    local_50 = anon_unknown_15::convert(local_4c);
    std::
    vector<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
    ::push_back(&__return_storage_ptr__->arguments,&local_50);
    __gnu_cxx::
    __normal_iterator<const_skiwi::external_function::argtype_*,_std::vector<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

ASM::external_function convert_external_to_vm(const external_function& ext)
{
    ASM::external_function ef;
    ef.name = ext.name;
    ef.address = ext.address;
    ef.return_type = convert(ext.return_type);
    for (auto arg : ext.arguments)
      {
      ef.arguments.push_back(convert(arg));
      }
    return ef;
}